

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ConfigDeclarationSyntax::setChild
          (ConfigDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004fb8fc + *(int *)(&DAT_004fb8fc + index * 4)))();
  return;
}

Assistant:

void ConfigDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: config = child.token(); return;
        case 2: name = child.token(); return;
        case 3: semi1 = child.token(); return;
        case 4: localparams = child.node()->as<SyntaxList<ParameterDeclarationStatementSyntax>>(); return;
        case 5: design = child.token(); return;
        case 6: topCells = child.node()->as<SyntaxList<ConfigCellIdentifierSyntax>>(); return;
        case 7: semi2 = child.token(); return;
        case 8: rules = child.node()->as<SyntaxList<ConfigRuleSyntax>>(); return;
        case 9: endconfig = child.token(); return;
        case 10: blockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}